

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

bool ExpressionRunnerSetLocalValue
               (ExpressionRunnerRef runner,BinaryenIndex index,BinaryenExpressionRef value)

{
  undefined1 local_68 [8];
  Flow setFlow;
  
  wasm::ExpressionRunner<wasm::CExpressionRunner>::visit
            ((Flow *)local_68,(ExpressionRunner<wasm::CExpressionRunner> *)runner,value);
  if (setFlow.breakTo.super_IString.str._M_len == 0) {
    wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::setLocalValue
              (&runner->super_ConstantExpressionRunner<wasm::CExpressionRunner>,index,
               (Literals *)local_68);
  }
  wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_68);
  return setFlow.breakTo.super_IString.str._M_len == 0;
}

Assistant:

bool ExpressionRunnerSetLocalValue(ExpressionRunnerRef runner,
                                   BinaryenIndex index,
                                   BinaryenExpressionRef value) {
  auto* R = (CExpressionRunner*)runner;
  auto setFlow = R->visit(value);
  if (!setFlow.breaking()) {
    R->setLocalValue(index, setFlow.values);
    return 1;
  }
  return 0;
}